

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

double Logger::log(double __x)

{
  char cVar1;
  undefined4 threadId_00;
  char in_AL;
  int iVar2;
  pthread_t pVar3;
  time_t tVar4;
  char *pcVar5;
  LogEvent *this;
  ulong time;
  FileAppender *this_00;
  ConsoleAppender *this_01;
  element_type *this_02;
  ulong in_RCX;
  string *in_RDX;
  uint32_t in_ESI;
  Level in_EDI;
  longlong *local_3e8;
  double *local_3b8;
  double *local_380;
  undefined8 *local_328;
  int *local_300;
  double local_2c8 [6];
  double local_298;
  shared_ptr<Appender> local_218;
  undefined1 local_201;
  shared_ptr<LogEvent> local_200;
  shared_ptr<Appender> local_1f0;
  undefined1 local_1d9;
  shared_ptr<LogEvent> local_1d8;
  shared_ptr<Appender> local_1c8;
  undefined1 local_1b8 [8];
  ptr appender;
  string local_1a0;
  string local_180;
  undefined1 local_160 [8];
  ptr event;
  string local_148;
  string local_128;
  string local_108;
  allocator local_e1;
  string local_e0 [32];
  string local_c0;
  int local_8c;
  string local_88 [4];
  int i;
  string parmString;
  va_list valist;
  int formatLength;
  int fmt_status;
  string content;
  uint32_t nowTime;
  uint32_t threadId;
  string *format_local;
  string *funName_local;
  uint32_t line_local;
  Level level_local;
  
  if (in_AL != '\0') {
    local_298 = __x;
  }
  if ((int)m_level <= (int)in_EDI) {
    pVar3 = pthread_self();
    content.field_2._12_4_ = (undefined4)pVar3;
    tVar4 = ::time((time_t *)0x0);
    content.field_2._8_4_ = (undefined4)tVar4;
    std::__cxx11::string::string((string *)&formatLength);
    iVar2 = std::__cxx11::string::length();
    valist[0]._0_8_ = &stack0x00000008;
    parmString.field_2._12_4_ = 0x30;
    parmString.field_2._8_4_ = 0x20;
    std::__cxx11::string::string(local_88);
    for (local_8c = 0; local_8c < iVar2; local_8c = local_8c + 1) {
      if ((local_8c + 1 < iVar2) &&
         (pcVar5 = (char *)std::__cxx11::string::operator[](in_RCX), *pcVar5 == '%')) {
        local_8c = local_8c + 1;
        pcVar5 = (char *)std::__cxx11::string::operator[](in_RCX);
        cVar1 = *pcVar5;
        if (cVar1 == '%') {
          std::__cxx11::string::push_back((char)&formatLength);
        }
        else if (cVar1 == 'c') {
          if ((uint)parmString.field_2._8_4_ < 0x29) {
            parmString.field_2._8_4_ = parmString.field_2._8_4_ + 8;
          }
          else {
            valist[0]._0_8_ = valist[0]._0_8_ + 8;
          }
          std::__cxx11::string::push_back((char)&formatLength);
        }
        else if (cVar1 == 'd') {
          if ((uint)parmString.field_2._8_4_ < 0x29) {
            local_300 = (int *)((long)local_2c8 + (long)(int)parmString.field_2._8_4_);
            parmString.field_2._8_4_ = parmString.field_2._8_4_ + 8;
          }
          else {
            local_300 = (int *)valist[0]._0_8_;
            valist[0]._0_8_ = valist[0]._0_8_ + 8;
          }
          std::__cxx11::to_string(&local_c0,*local_300);
          std::__cxx11::string::operator=(local_88,(string *)&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
          std::__cxx11::string::append((string *)&formatLength);
        }
        else if (cVar1 == 'f') {
          if ((uint)parmString.field_2._12_4_ < 0xa1) {
            local_380 = (double *)((long)local_2c8 + (long)(int)parmString.field_2._12_4_);
            parmString.field_2._12_4_ = parmString.field_2._12_4_ + 0x10;
          }
          else {
            local_380 = (double *)valist[0]._0_8_;
            valist[0]._0_8_ = valist[0]._0_8_ + 8;
          }
          std::__cxx11::to_string(&local_108,*local_380);
          std::__cxx11::string::operator=(local_88,(string *)&local_108);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::append((string *)&formatLength);
        }
        else if (cVar1 == 'l') {
          if (local_8c + 1 < iVar2) {
            pcVar5 = (char *)std::__cxx11::string::operator[](in_RCX);
            if (*pcVar5 == 'f') {
              local_8c = local_8c + 1;
              if ((uint)parmString.field_2._12_4_ < 0xa1) {
                local_3b8 = (double *)((long)local_2c8 + (long)(int)parmString.field_2._12_4_);
                parmString.field_2._12_4_ = parmString.field_2._12_4_ + 0x10;
              }
              else {
                local_3b8 = (double *)valist[0]._0_8_;
                valist[0]._0_8_ = valist[0]._0_8_ + 8;
              }
              std::__cxx11::to_string(&local_128,*local_3b8);
              std::__cxx11::string::operator=(local_88,(string *)&local_128);
              std::__cxx11::string::~string((string *)&local_128);
              std::__cxx11::string::append((string *)&formatLength);
            }
            else {
              pcVar5 = (char *)std::__cxx11::string::operator[](in_RCX);
              if (*pcVar5 != 'd') {
                event.super___shared_ptr<LogEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                _4_4_ = 1;
                goto LAB_00106b66;
              }
              local_8c = local_8c + 1;
              if ((uint)parmString.field_2._8_4_ < 0x29) {
                local_3e8 = (longlong *)((long)local_2c8 + (long)(int)parmString.field_2._8_4_);
                parmString.field_2._8_4_ = parmString.field_2._8_4_ + 8;
              }
              else {
                local_3e8 = (longlong *)valist[0]._0_8_;
                valist[0]._0_8_ = valist[0]._0_8_ + 8;
              }
              std::__cxx11::to_string(&local_148,*local_3e8);
              std::__cxx11::string::operator=(local_88,(string *)&local_148);
              std::__cxx11::string::~string((string *)&local_148);
              std::__cxx11::string::append((string *)&formatLength);
            }
          }
        }
        else if (cVar1 == 's') {
          if ((uint)parmString.field_2._8_4_ < 0x29) {
            local_328 = (undefined8 *)((long)local_2c8 + (long)(int)parmString.field_2._8_4_);
            parmString.field_2._8_4_ = parmString.field_2._8_4_ + 8;
          }
          else {
            local_328 = (undefined8 *)valist[0]._0_8_;
            valist[0]._0_8_ = valist[0]._0_8_ + 8;
          }
          pcVar5 = (char *)*local_328;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_e0,pcVar5,&local_e1);
          std::__cxx11::string::operator=(local_88,local_e0);
          std::__cxx11::string::~string(local_e0);
          std::allocator<char>::~allocator((allocator<char> *)&local_e1);
          std::__cxx11::string::append((string *)&formatLength);
        }
      }
      else {
        std::__cxx11::string::operator[](in_RCX);
        std::__cxx11::string::push_back((char)&formatLength);
      }
    }
    this = (LogEvent *)operator_new(0x58);
    threadId_00 = content.field_2._12_4_;
    appender.super___shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 1;
    time = (ulong)(uint)content.field_2._8_4_;
    std::__cxx11::string::string((string *)&local_180,in_RDX);
    std::__cxx11::string::string((string *)&local_1a0,(string *)&formatLength);
    LogEvent::LogEvent(this,in_ESI,threadId_00,time,in_EDI,&local_180,&local_1a0);
    appender.super___shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
    std::shared_ptr<LogEvent>::shared_ptr<LogEvent,void>((shared_ptr<LogEvent> *)local_160,this);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_180);
    std::shared_ptr<Appender>::shared_ptr((shared_ptr<Appender> *)local_1b8,(nullptr_t)0x0);
    if (m_target == FILE) {
      this_00 = (FileAppender *)operator_new(0x18);
      local_1d9 = 1;
      std::shared_ptr<LogEvent>::shared_ptr(&local_1d8,(shared_ptr<LogEvent> *)local_160);
      FileAppender::FileAppender(this_00,&local_1d8);
      local_1d9 = 0;
      std::shared_ptr<Appender>::shared_ptr<FileAppender,void>(&local_1c8,this_00);
      std::shared_ptr<Appender>::operator=((shared_ptr<Appender> *)local_1b8,&local_1c8);
      std::shared_ptr<Appender>::~shared_ptr(&local_1c8);
      std::shared_ptr<LogEvent>::~shared_ptr(&local_1d8);
    }
    else {
      this_01 = (ConsoleAppender *)operator_new(0x18);
      local_201 = 1;
      std::shared_ptr<LogEvent>::shared_ptr(&local_200,(shared_ptr<LogEvent> *)local_160);
      ConsoleAppender::ConsoleAppender(this_01,&local_200);
      local_201 = 0;
      std::shared_ptr<Appender>::shared_ptr<ConsoleAppender,void>(&local_1f0,this_01);
      std::shared_ptr<Appender>::operator=((shared_ptr<Appender> *)local_1b8,&local_1f0);
      std::shared_ptr<Appender>::~shared_ptr(&local_1f0);
      std::shared_ptr<LogEvent>::~shared_ptr(&local_200);
    }
    this_02 = std::__shared_ptr_access<ThreadPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<ThreadPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&m_threadPool);
    std::shared_ptr<Appender>::shared_ptr(&local_218,(shared_ptr<Appender> *)local_1b8);
    ThreadPool::add(this_02,&local_218);
    std::shared_ptr<Appender>::~shared_ptr(&local_218);
    std::shared_ptr<Appender>::~shared_ptr((shared_ptr<Appender> *)local_1b8);
    std::shared_ptr<LogEvent>::~shared_ptr((shared_ptr<LogEvent> *)local_160);
    event.super___shared_ptr<LogEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
LAB_00106b66:
    std::__cxx11::string::~string(local_88);
    __x = (double)std::__cxx11::string::~string((string *)&formatLength);
  }
  return __x;
}

Assistant:

void Logger::log(LogLevel::Level level,uint32_t line,std::string funName,std::string format,...)
{
	if(level<m_level)
		return;
	uint32_t threadId=pthread_self();
	uint32_t nowTime=time(0);
	std::string content;
	int fmt_status=0;
	int formatLength=format.length();
	va_list valist;
	va_start(valist,format);
	std::string parmString;
	for(int i=0;i<formatLength;i++){
	 	if(i+1<formatLength&&format[i]=='%'){
			switch(format[++i]){
			case 'd':
				parmString=std::to_string(va_arg(valist,int));
				content.append(parmString);
				break;
			case 's':
				parmString=std::string(va_arg(valist,char*));
				content.append(parmString);
				break;
			case 'c':
				content.push_back(static_cast<char>(va_arg(valist,int)));
				break;
			case 'f':
				parmString=std::to_string(va_arg(valist,double));
				content.append(parmString);
				break;
			case 'l':
				if(i+1<formatLength){
					if(format[i+1]=='f'){
						i++;
						parmString=std::to_string(va_arg(valist,double));
						content.append(parmString);
					}
					else if(format[i+1]=='d'){
						i++;
						parmString=std::to_string(va_arg(valist,long long));
						content.append(parmString);
					}
					else
						return;
				}
				break;
			case '%':
				content.push_back('%');
				break;
			}
		}
		else{
			content.push_back(format[i]);
		}
	}
	LogEvent::ptr event(new LogEvent(line,threadId,nowTime,level,funName,content));
	Appender::ptr appender=nullptr;
	if(m_target==LogTarget::FILE){
		appender=Appender::ptr(new FileAppender(event));
	}
	else{
		appender=Appender::ptr(new ConsoleAppender(event));
	}
	m_threadPool->add(appender);
}